

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall mocker::Annotator::operator()(Annotator *this,FuncCallExpr *node)

{
  pointer psVar1;
  long lVar2;
  bool bVar3;
  __shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *rhs;
  CompileError *pCVar4;
  mapped_type *pmVar5;
  __shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2> *this_02;
  UnresolvableSymbol *this_03;
  ulong uVar6;
  long lVar7;
  shared_ptr<mocker::ast::ClassDecl> decl;
  __shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<mocker::ast::FuncDecl> funcDecl;
  FuncCallExpr *local_38;
  
  setInstance(this,node);
  getFuncDecl((Annotator *)&funcDecl,(FuncCallExpr *)this);
  if (funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_03 = (UnresolvableSymbol *)__cxa_allocate_exception(0x68);
    decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this->pos,(key_type *)&decl);
    UnresolvableSymbol::UnresolvableSymbol
              (this_03,pmVar5,
               &((node->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
    __cxa_throw(this_03,&UnresolvableSymbol::typeinfo,UnresolvableSymbol::~UnresolvableSymbol);
  }
  decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  this_00 = (__shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->ctx->associatedDecl,(key_type *)&decl);
  std::__shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
            );
  if ((long)(node->args).
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(node->args).
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)((funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->formalParameters).
            super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)((funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->formalParameters).
            super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0xffffffffffffffff;
    lVar7 = 0;
    do {
      psVar1 = (node->args).
               super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      if ((ulong)((long)(node->args).
                        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar6) {
        bVar3 = std::operator==(&(((funcDecl.
                                    super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->identifier).
                                  super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->val,"_ctor_");
        if (bVar3) {
          SymTbl::lookUp((SymTbl *)&local_58,(ScopeID *)&this->ctx->syms,
                         (string *)&this->scopeResiding);
          std::static_pointer_cast<mocker::ast::ClassDecl,mocker::ast::Declaration>
                    ((shared_ptr<mocker::ast::Declaration> *)&decl);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
          std::make_shared<mocker::ast::UserDefinedType,std::shared_ptr<mocker::ast::Identifier>&>
                    ((shared_ptr<mocker::ast::Identifier> *)&local_58);
          local_38 = node;
          this_01 = (__shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2> *)
                    std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->ctx->exprType,(key_type *)&local_38);
          std::__shared_ptr<mocker::ast::Type,(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_01,&local_58);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)node;
          this_02 = &std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->ctx->exprType,(key_type *)&decl)->
                     super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_02,&((funcDecl.
                                super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->retType).
                              super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&funcDecl.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return;
      }
      std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ast::Expression,void>
                ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&decl,
                 (__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar1->
                         super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar7));
      visit(this,(shared_ptr<mocker::ast::ASTNode> *)&decl);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      lVar2 = *(long *)((long)&((((funcDecl.
                                   super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->formalParameters).
                                 super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar7);
      decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)&(((node->args).
                      super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            + lVar7);
      rhs = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->ctx->exprType,(key_type *)&decl);
      bVar3 = assignable(this,(shared_ptr<mocker::ast::Type> *)(lVar2 + 0x18),rhs);
      lVar7 = lVar7 + 0x10;
    } while (bVar3);
    pCVar4 = (CompileError *)__cxa_allocate_exception(0x48);
    decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)node;
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this->pos,(key_type *)&decl);
    CompileError::CompileError(pCVar4,pmVar5->first,pmVar5->second);
    *(undefined ***)pCVar4 = &PTR__CompileError_001f3a60;
    __cxa_throw(pCVar4,&InvalidFunctionCall::typeinfo,CompileError::~CompileError);
  }
  pCVar4 = (CompileError *)__cxa_allocate_exception(0x48);
  decl.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  pmVar5 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this->pos,(key_type *)&decl);
  CompileError::CompileError(pCVar4,pmVar5->first,pmVar5->second);
  *(undefined ***)pCVar4 = &PTR__CompileError_001f3a60;
  __cxa_throw(pCVar4,&InvalidFunctionCall::typeinfo,CompileError::~CompileError);
}

Assistant:

void operator()(ast::FuncCallExpr &node) const override {
    setInstance(node);
    auto funcDecl = getFuncDecl(node);
    if (!funcDecl)
      throw UnresolvableSymbol(pos.at(node.identifier->getID()),
                               node.identifier->val);

    ctx.associatedDecl[node.identifier->getID()] = funcDecl;

    if (node.args.size() != funcDecl->formalParameters.size())
      throw InvalidFunctionCall(pos.at(node.getID()));
    for (std::size_t i = 0; i < node.args.size(); ++i) {
      visit(node.args[i]);
      if (!assignable(funcDecl->formalParameters[i]->type,
                      ctx.exprType[node.args[i]->getID()]))
        throw InvalidFunctionCall(pos.at(node.getID()));
    }

    if (funcDecl->identifier->val == "_ctor_") {
      auto decl = std::static_pointer_cast<ast::ClassDecl>(
          ctx.syms.lookUp(scopeResiding, node.identifier->val));
      ctx.exprType[node.getID()] =
          std::make_shared<ast::UserDefinedType>(decl->identifier);
    } else {
      ctx.exprType[node.getID()] = funcDecl->retType;
    }
  }